

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutex.cpp
# Opt level: O1

UBool icu_63::umtx_initImplPreInit(UInitOnce *uio)

{
  int iVar1;
  UBool UVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)initMutex);
  if ((uio->fState).super___atomic_base<int>._M_i == 0) {
    (uio->fState).super___atomic_base<int>._M_i = 1;
    UVar2 = '\x01';
  }
  else {
    iVar1 = (uio->fState).super___atomic_base<int>._M_i;
    while (iVar1 == 1) {
      pthread_cond_wait((pthread_cond_t *)initCondition,(pthread_mutex_t *)initMutex);
      iVar1 = (uio->fState).super___atomic_base<int>._M_i;
    }
    UVar2 = '\0';
  }
  pthread_mutex_unlock((pthread_mutex_t *)initMutex);
  return UVar2;
}

Assistant:

U_COMMON_API UBool U_EXPORT2
umtx_initImplPreInit(UInitOnce &uio) {
    pthread_mutex_lock(&initMutex);
    int32_t state = uio.fState;
    if (state == 0) {
        umtx_storeRelease(uio.fState, 1);
        pthread_mutex_unlock(&initMutex);
        return TRUE;   // Caller will next call the init function.
    } else {
        while (uio.fState == 1) {
            // Another thread is currently running the initialization.
            // Wait until it completes.
            pthread_cond_wait(&initCondition, &initMutex);
        }
        pthread_mutex_unlock(&initMutex);
        U_ASSERT(uio.fState == 2);
        return FALSE;
    }
}